

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall glcts::LayoutBindingBaseCase::init(LayoutBindingBaseCase *this,EVP_PKEY_CTX *ctx)

{
  Texture2DArray *this_00;
  Texture3D *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  mapped_type *ppTVar4;
  Texture2D *pTVar5;
  undefined4 extraout_var_00;
  Texture2D *pTVar6;
  mapped_type pTVar7;
  undefined4 extraout_var_01;
  RenderContext *pRVar8;
  Texture2DArray *pTVar9;
  PixelBufferAccess *pPVar10;
  mapped_type *ppTVar11;
  undefined4 extraout_var_02;
  Texture3D *pTVar12;
  mapped_type *ppTVar13;
  LayoutBindingSubTest (*data) [14];
  key_type_conflict local_288 [2];
  _Self local_280;
  key_type_conflict local_274;
  _Self local_270;
  mapped_type local_268;
  Texture3D *texture3D;
  _Self local_258;
  key_type_conflict local_24c;
  _Self local_248;
  mapped_type local_240;
  Texture2DArray *texture2DArray;
  _Self local_230;
  key_type_conflict local_224;
  _Self local_220 [3];
  Texture2D *local_208;
  ImmutableTexture2D *texture2D;
  float fStack_1f8;
  float fStack_1f4;
  vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  local_1f0;
  glcts local_1d8 [8];
  LayoutBindingSubTest tests [14];
  LayoutBindingBaseCase *this_local;
  
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])();
  this->m_drawTest = (ulong)(iVar2 == 2) * 8 + 0x129;
  *(undefined8 *)&this->field_0x88 = 0;
  memcpy(local_1d8,&PTR_anon_var_dwarf_4c3c61_0324bd00,0x1c0);
  makeVector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,14ul>(&local_1f0,local_1d8,data);
  std::
  vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ::operator=(&this->m_tests,&local_1f0);
  std::
  vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ::~vector(&local_1f0);
  this->m_uniformDeclTemplate =
       "${LAYOUT}${KEYWORD}${UNIFORM_TYPE}${UNIFORM_BLOCK_NAME}${UNIFORM_BLOCK}${UNIFORM_INSTANCE_NAME}${UNIFORM_ARRAY};\n"
  ;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texture2D,0.0,1.0,0.0,1.0);
  (this->m_expectedColor).m_data[0] = texture2D._0_4_;
  (this->m_expectedColor).m_data[1] = texture2D._4_4_;
  (this->m_expectedColor).m_data[2] = fStack_1f8;
  (this->m_expectedColor).m_data[3] = fStack_1f4;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  uVar3 = (ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0xc);
  ppTVar4 = (mapped_type *)(uVar3 - 5);
  if (uVar3 < 5 || ppTVar4 == (mapped_type *)0x0) {
    ppTVar4 = (mapped_type *)
              ((long)&switchD_013a5f6d::switchdataD_02a96ec8 +
              (long)(int)(&switchD_013a5f6d::switchdataD_02a96ec8)[uVar3]);
    switch(ppTVar4) {
    case (mapped_type *)0x13a5f6f:
      pTVar5 = (Texture2D *)operator_new(0x70);
      iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
      pRVar8 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var_00,iVar2));
      glu::ImmutableTexture2D::ImmutableTexture2D((ImmutableTexture2D *)pTVar5,pRVar8,0x8058,2,2);
      local_208 = pTVar5;
      pTVar6 = glu::Texture2D::getRefTexture(pTVar5);
      tcu::Texture2D::allocLevel(pTVar6,0);
      pTVar6 = glu::Texture2D::getRefTexture(local_208);
      pPVar10 = tcu::TextureLevelPyramid::getLevel(&pTVar6->super_TextureLevelPyramid,0);
      tcu::clear(pPVar10,&this->m_expectedColor);
      (*local_208->_vptr_Texture2D[2])();
      local_224 = 0;
      local_220[0]._M_node =
           (_Base_ptr)
           std::
           map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
           ::find(&this->m_textures2D,&local_224);
      local_230._M_node =
           (_Base_ptr)
           std::
           map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
           ::end(&this->m_textures2D);
      bVar1 = std::operator!=(local_220,&local_230);
      if (bVar1) {
        texture2DArray._4_4_ = 0;
        ppTVar4 = std::
                  map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
                  ::operator[](&this->m_textures2D,(key_type_conflict *)((long)&texture2DArray + 4))
        ;
        if (*ppTVar4 != (mapped_type)0x0) {
          (*(*ppTVar4)->_vptr_Texture2D[1])();
        }
      }
      pTVar5 = local_208;
      texture2DArray._0_4_ = 0;
      ppTVar4 = std::
                map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
                ::operator[](&this->m_textures2D,(key_type_conflict *)&texture2DArray);
      *ppTVar4 = pTVar5;
      break;
    case (mapped_type *)0x13a612e:
      pTVar7 = (mapped_type)operator_new(0x70);
      iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
      pRVar8 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var_01,iVar2));
      glu::Texture2DArray::Texture2DArray((Texture2DArray *)pTVar7,pRVar8,0x8058,2,2,1);
      local_240 = pTVar7;
      pTVar9 = glu::Texture2DArray::getRefTexture((Texture2DArray *)pTVar7);
      tcu::Texture2DArray::allocLevel(pTVar9,0);
      pTVar9 = glu::Texture2DArray::getRefTexture((Texture2DArray *)local_240);
      pPVar10 = tcu::TextureLevelPyramid::getLevel(&pTVar9->super_TextureLevelPyramid,0);
      tcu::clear(pPVar10,&this->m_expectedColor);
      glu::Texture2DArray::upload((Texture2DArray *)local_240);
      local_24c = 0;
      local_248._M_node =
           (_Base_ptr)
           std::
           map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
           ::find(&this->m_textures2DArray,&local_24c);
      local_258._M_node =
           (_Base_ptr)
           std::
           map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
           ::end(&this->m_textures2DArray);
      bVar1 = std::operator!=(&local_248,&local_258);
      if (bVar1) {
        texture3D._4_4_ = 0;
        ppTVar11 = std::
                   map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
                   ::operator[](&this->m_textures2DArray,(key_type_conflict *)((long)&texture3D + 4)
                               );
        this_00 = *ppTVar11;
        if (this_00 != (Texture2DArray *)0x0) {
          glu::Texture2DArray::~Texture2DArray(this_00);
          operator_delete(this_00,0x70);
        }
      }
      pTVar7 = local_240;
      texture3D._0_4_ = 0;
      ppTVar4 = (mapped_type *)
                std::
                map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
                ::operator[](&this->m_textures2DArray,(key_type_conflict *)&texture3D);
      *ppTVar4 = pTVar7;
      break;
    case (mapped_type *)0x13a6302:
      pTVar7 = (mapped_type)operator_new(0x70);
      iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
      pRVar8 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var_02,iVar2));
      glu::Texture3D::Texture3D((Texture3D *)pTVar7,pRVar8,0x8058,2,2,1);
      local_268 = pTVar7;
      pTVar12 = glu::Texture3D::getRefTexture((Texture3D *)pTVar7);
      tcu::Texture3D::allocLevel(pTVar12,0);
      pTVar12 = glu::Texture3D::getRefTexture((Texture3D *)local_268);
      pPVar10 = tcu::TextureLevelPyramid::getLevel(&pTVar12->super_TextureLevelPyramid,0);
      tcu::clear(pPVar10,&this->m_expectedColor);
      glu::Texture3D::upload((Texture3D *)local_268);
      local_274 = 0;
      local_270._M_node =
           (_Base_ptr)
           std::
           map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
           ::find(&this->m_textures3D,&local_274);
      local_280._M_node =
           (_Base_ptr)
           std::
           map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
           ::end(&this->m_textures3D);
      bVar1 = std::operator!=(&local_270,&local_280);
      if (bVar1) {
        local_288[1] = 0;
        ppTVar13 = std::
                   map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
                   ::operator[](&this->m_textures3D,local_288 + 1);
        this_01 = *ppTVar13;
        if (this_01 != (Texture3D *)0x0) {
          glu::Texture3D::~Texture3D(this_01);
          operator_delete(this_01,0x70);
        }
      }
      pTVar7 = local_268;
      local_288[0] = 0;
      ppTVar4 = (mapped_type *)
                std::
                map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
                ::operator[](&this->m_textures3D,local_288);
      *ppTVar4 = pTVar7;
      break;
    case (mapped_type *)0x13a64d0:
      break;
    case (mapped_type *)0x13a64d2:
      goto switchD_013a5f6d_caseD_1;
    }
  }
  else {
switchD_013a5f6d_caseD_1:
  }
  return (int)ppTVar4;
}

Assistant:

void init(void)
	{
		m_drawTest =
			(getStage() == ComputeShader) ? &LayoutBindingBaseCase::drawTestCompute : &LayoutBindingBaseCase::drawTest;

#define MAKE_TEST_ENTRY(__subtest_name__) { #__subtest_name__, "", &LayoutBindingBaseCase::__subtest_name__ }
		LayoutBindingSubTest tests[] = {
			MAKE_TEST_ENTRY(binding_basic_default),		 MAKE_TEST_ENTRY(binding_basic_explicit),
			MAKE_TEST_ENTRY(binding_basic_multiple),	 MAKE_TEST_ENTRY(binding_basic_render),
			MAKE_TEST_ENTRY(binding_integer_constant),   MAKE_TEST_ENTRY(binding_integer_constant_expression),
			MAKE_TEST_ENTRY(binding_array_size),		 MAKE_TEST_ENTRY(binding_array_implicit),
			MAKE_TEST_ENTRY(binding_array_multiple),	 MAKE_TEST_ENTRY(binding_api_update),
			MAKE_TEST_ENTRY(binding_compilation_errors), MAKE_TEST_ENTRY(binding_link_errors),
			MAKE_TEST_ENTRY(binding_examples),			 MAKE_TEST_ENTRY(binding_mixed_order)
		};
		m_tests = makeVector(tests);

		m_uniformDeclTemplate = "${LAYOUT}${KEYWORD}${UNIFORM_TYPE}${UNIFORM_BLOCK_NAME}${UNIFORM_BLOCK}${UNIFORM_"
								"INSTANCE_NAME}${UNIFORM_ARRAY};\n";

		m_expectedColor = tcu::Vec4(0.0, 1.0f, 0.0f, 1.0f);

		switch (getTestParameters().texture_type)
		{
		case TwoD:
		{
			// 2D
			glu::ImmutableTexture2D* texture2D =
				new glu::ImmutableTexture2D(getContext().getRenderContext(), GL_RGBA8, 2, 2);

			texture2D->getRefTexture().allocLevel(0);
			tcu::clear(texture2D->getRefTexture().getLevel(0), m_expectedColor);
			texture2D->upload();

			if (m_textures2D.find(0) != m_textures2D.end())
			{
				delete m_textures2D[0];
			}

			m_textures2D[0] = texture2D;
		}
		break;
		case TwoDArray:
		{
			// 2DArray
			glu::Texture2DArray* texture2DArray =
				new glu::Texture2DArray(getContext().getRenderContext(), GL_RGBA8, 2, 2, 1);

			texture2DArray->getRefTexture().allocLevel(0);
			tcu::clear(texture2DArray->getRefTexture().getLevel(0), m_expectedColor);
			texture2DArray->upload();

			if (m_textures2DArray.find(0) != m_textures2DArray.end())
			{
				delete m_textures2DArray[0];
			}

			m_textures2DArray[0] = texture2DArray;
		}
		break;
		// 3D
		case ThreeD:
		{
			glu::Texture3D* texture3D = new glu::Texture3D(getContext().getRenderContext(), GL_RGBA8, 2, 2, 1);

			texture3D->getRefTexture().allocLevel(0);
			tcu::clear(texture3D->getRefTexture().getLevel(0), m_expectedColor);
			texture3D->upload();

			if (m_textures3D.find(0) != m_textures3D.end())
			{
				delete m_textures3D[0];
			}

			m_textures3D[0] = texture3D;
		}
		break;
		case None:
			// test case where no texture allocation is needed
			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}